

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O1

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  _Base_ptr *this_00;
  pointer puVar1;
  pointer puVar2;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  Index index;
  Module *pMVar7;
  Type *pTVar8;
  Type *pTVar9;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> this_01;
  _Base_ptr p_Var10;
  Type TVar11;
  Expression *pEVar12;
  mapped_type *pppEVar13;
  undefined1 auVar14 [8];
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  Type in_R8;
  undefined1 local_e0 [8];
  FindAll<wasm::LocalGet> gets;
  undefined1 local_a8 [8];
  Iterator __end3;
  Type local_70;
  Builder builder;
  Iterator __begin3;
  _Rb_tree_const_iterator<wasm::LocalSet_*> local_50;
  __uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_> local_48;
  Expression *value;
  Module *local_38;
  LocalGet *get;
  
  __end3.flexibleIterator._M_node = (_Base_ptr)graph;
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_e0,this->func->body);
  if (local_e0 !=
      (undefined1  [8])
      gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &__end3.flexibleIterator._M_node[1]._M_right;
    gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(__end3.flexibleIterator._M_node + 2);
    auVar14 = local_e0;
    do {
      local_38 = *(Module **)auVar14;
      pMVar7 = (Module *)
               std::__detail::
               _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)__end3.flexibleIterator._M_node,(key_type *)&local_38);
      p_Var16 = (_Base_ptr)
                (pMVar7->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      p_Var10 = p_Var16;
      if (p_Var16 == (_Base_ptr)0x0) {
        p_Var10 = (_Base_ptr)
                  (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                     *)&pMVar7->exports)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
      }
      if (p_Var10 != (_Base_ptr)0x0) {
        if (p_Var10 == (_Base_ptr)0x1) {
          p_Var10 = p_Var16;
          if (p_Var16 != (_Base_ptr)0x0) {
            p_Var10 = (_Base_ptr)
                      (pMVar7->globals).
                      super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          p_Var10 = p_Var10 + 1;
          if (p_Var16 == (_Base_ptr)0x0) {
            p_Var10 = (_Base_ptr)
                      &(((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                          *)&pMVar7->exports)->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                       storage;
          }
          if (*(long *)p_Var10 == 0) {
            bVar5 = Function::isParam(this->func,
                                      *(Index *)&(local_38->exports).
                                                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
            ;
            if (!bVar5) {
              local_a8 = (undefined1  [8])
                         ((Type *)&(local_38->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->id;
              bVar5 = wasm::Type::isNonNullable((Type *)local_a8);
              if (!bVar5) {
                bVar5 = wasm::Type::isTuple((Type *)local_a8);
                if (bVar5) {
                  builder.wasm = (Module *)local_a8;
                  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent = (Type *)0x0;
                  pTVar8 = (Type *)wasm::Type::size((Type *)builder.wasm);
                  bVar5 = builder.wasm == (Module *)local_a8 && pTVar8 == (Type *)0x0;
                  while (!bVar5) {
                    pTVar9 = wasm::Type::Iterator::operator*((Iterator *)&builder);
                    local_70.id = pTVar9->id;
                    bVar6 = wasm::Type::isNonNullable(&local_70);
                    if (bVar6) {
                      if (!bVar5) goto LAB_0093a92c;
                      break;
                    }
                    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    parent = (Type *)((long)&(__begin3.
                                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                             .parent)->id + 1);
                    bVar5 = builder.wasm == (Module *)local_a8 &&
                            __begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent == pTVar8;
                  }
                }
                pEVar12 = LiteralUtils::makeZero
                                    ((Type)((Type *)&(local_38->exports).
                                                                                                          
                                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)->id,
                                     this->module);
                builder.wasm = local_38;
                pppEVar13 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)&builder);
                **pppEVar13 = pEVar12;
              }
            }
          }
          else {
            *(undefined4 *)
             &(local_38->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 *(undefined4 *)(*(long *)p_Var10 + 0x10);
          }
        }
        else if (this->allowMerges == true) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = ((Type *)&(local_38->exports).
                                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->id;
          index = Builder::addVar((Builder *)this->func,(Function *)0x0,(Name)(auVar4 << 0x40),in_R8
                                 );
          value._4_4_ = *(Id *)&(local_38->exports).
                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          *(Index *)&(local_38->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage = index;
          local_70.id = (uintptr_t)this->module;
          puVar1 = (pMVar7->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          bVar5 = puVar1 == (pointer)0x0;
          local_50._M_node = (_Base_ptr)0x0;
          if (bVar5) {
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
          }
          else {
            local_50._M_node =
                 (_Base_ptr)
                 (pMVar7->globals).
                 super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          __end3.fixedIndex = 0;
          local_a8 = (undefined1  [8])pMVar7;
          __end3.parent._0_1_ = bVar5;
          builder.wasm = pMVar7;
          if (puVar1 == (pointer)0x0) {
            __end3._8_8_ = (((SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                              *)&pMVar7->exports)->fixed).
                           super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
          }
          else {
            __end3.fixedIndex =
                 (size_t)&(((set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>
                             *)&pMVar7->functions)->_M_t)._M_impl.super__Rb_tree_header;
          }
          while (bVar6 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                         ::
                         IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                         ::operator==((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                       *)&builder,(Iterator *)local_a8), !bVar6) {
            p_Var15 = local_50._M_node + 1;
            if (bVar5) {
              p_Var15 = (_Rb_tree_node_base *)
                        (&((builder.wasm)->exports).
                          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish +
                        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                        .index);
            }
            puVar2 = *(pointer *)p_Var15;
            if (puVar2 == (pointer)0x0) {
              bVar6 = Function::isParam(this->func,value._4_4_);
              if (bVar6) {
                TVar11 = Function::getLocalType(this->func,value._4_4_);
                pEVar12 = (Expression *)
                          MixedArena::allocSpace((MixedArena *)(local_70.id + 0x158),0x18,8);
                pEVar12->_id = LocalGetId;
                pEVar12[1]._id = value._4_4_;
                (pEVar12->type).id = TVar11.id;
                local_48._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                     (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
                     Builder::makeLocalSet((Builder *)&local_70,index,pEVar12);
                std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
                emplace_back<wasm::Expression*>
                          ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                           &this->functionPrepends,(Expression **)&local_48);
              }
            }
            else {
              uVar3._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = puVar2[3]._M_t;
              TVar11.id = ((Type *)&(local_38->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->id;
              local_48._M_t.
              super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                   (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
                   (tuple<wasm::Export_*,_std::default_delete<wasm::Export>_>)
                   uVar3._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              this_01._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
              _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
              super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
                   (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
                   MixedArena::allocSpace((MixedArena *)(local_70.id + 0x158),0x20,8);
              *(Id *)this_01._M_t.
                     super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                     super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl = LocalSetId;
              *(uintptr_t *)
               &((SpecificExpression<(wasm::Expression::Id)9> *)
                ((long)this_01._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 8))->
                super_Expression = 0;
              *(Index *)((long)this_01._M_t.
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x10) =
                   index;
              *(__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
               ((long)this_01._M_t.
                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                      super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x18) =
                   uVar3._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              LocalSet::makeTee((LocalSet *)
                                this_01._M_t.
                                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,TVar11);
              puVar2[3]._M_t =
                   this_01._M_t.
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
              p_Var10 = (_Base_ptr)
                        gets.list.
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
              for (p_Var16 = __end3.flexibleIterator._M_node[2]._M_parent; p_Var16 != (_Base_ptr)0x0
                  ; p_Var16 = (&p_Var16->_M_left)
                              [(ulong)*(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                        *)(p_Var16 + 1) <
                               (ulong)local_48._M_t.
                                      super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                      .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl]) {
                if ((ulong)*(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                            (p_Var16 + 1) >=
                    (ulong)local_48._M_t.
                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                           .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl) {
                  p_Var10 = p_Var16;
                }
              }
              p_Var16 = (_Base_ptr)
                        gets.list.
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
              if ((p_Var10 !=
                   (_Base_ptr)
                   gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage) &&
                 (p_Var16 = p_Var10,
                 (ulong)local_48._M_t.
                        super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                        super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl <
                 (ulong)*(_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_> *)
                         (p_Var10 + 1))) {
                p_Var16 = (_Base_ptr)
                          gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              if (p_Var16 !=
                  (_Base_ptr)
                  gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                pppEVar13 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)&local_48);
                if ((pointer)*pppEVar13 != puVar2 + 3) {
                  __assert_fail("graph.locations[value] == &set->value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/SSAify.cpp"
                                ,0xab,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
                }
                pppEVar13 = std::
                            map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                            ::operator[]((map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                                          *)this_00,(key_type *)&local_48);
                *pppEVar13 = (Expression **)
                             ((long)this_01._M_t.
                                    super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                    .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                             0x18);
              }
            }
            if (bVar5) {
              __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                   __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index + 1;
            }
            else {
              local_50._M_node = (_Base_ptr)std::_Rb_tree_increment(local_50._M_node);
            }
          }
        }
      }
LAB_0093a92c:
      auVar14 = (undefined1  [8])((long)auVar14 + 8);
    } while (auVar14 !=
             (undefined1  [8])
             gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
             _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e0,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_e0);
  }
  return;
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSetses[get];
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }